

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool __thiscall
cmCMakePresetsGraphInternal::MatchesCondition::Evaluate
          (MatchesCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  bool bVar1;
  bool bVar2;
  ExpandMacroResult EVar3;
  string regexStr;
  string str;
  RegularExpression regex;
  string local_138;
  string local_118;
  RegularExpression local_f8;
  
  std::__cxx11::string::string((string *)&local_118,(string *)&this->String);
  EVar3 = anon_unknown.dwarf_99812d::ExpandMacros(&local_118,expanders,version);
  if (EVar3 == Ignore) {
    bVar1 = true;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar3 == Error) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_138,(string *)&this->Regex);
    EVar3 = anon_unknown.dwarf_99812d::ExpandMacros(&local_138,expanders,version);
    if (EVar3 == Ignore) {
      bVar1 = true;
      if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged = false;
      }
    }
    else if (EVar3 == Error) {
      bVar1 = false;
    }
    else {
      local_f8.regmust = (char *)0x0;
      local_f8.program = (char *)0x0;
      local_f8.progsize = 0;
      memset(&local_f8,0,0xaa);
      bVar1 = cmsys::RegularExpression::compile(&local_f8,local_138._M_dataplus._M_p);
      if (bVar1) {
        bVar2 = cmsys::RegularExpression::find(&local_f8,local_118._M_dataplus._M_p);
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>
             = (_Optional_payload_base<bool>)(bVar2 | 0x100);
      }
      cmsys::RegularExpression::~RegularExpression(&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::__cxx11::string::~string((string *)&local_118);
  return bVar1;
}

Assistant:

bool cmCMakePresetsGraphInternal::MatchesCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);
  std::string regexStr = this->Regex;
  CHECK_EXPAND(out, regexStr, expanders, version);

  cmsys::RegularExpression regex;
  if (!regex.compile(regexStr)) {
    return false;
  }

  out = regex.find(str);
  return true;
}